

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c++
# Opt level: O1

EncodingResult<kj::Array<unsigned_char>_> * __thiscall
kj::decodeBinaryCEscape
          (EncodingResult<kj::Array<unsigned_char>_> *__return_storage_ptr__,kj *this,
          ArrayPtr<const_char> text,bool nulTerminate)

{
  kj kVar1;
  RemoveConst<unsigned_char> *pRVar2;
  uint uVar3;
  undefined2 uVar4;
  kj *pkVar5;
  ulong uVar6;
  undefined2 uVar7;
  int iVar8;
  char *pcVar10;
  size_t sVar11;
  kj *pkVar12;
  byte bVar13;
  ulong in_R10;
  char *pcVar14;
  char *pcVar15;
  uint value_2;
  uint uVar16;
  bool bVar17;
  bool bVar18;
  ArrayPtr<const_char32_t> utf16;
  ArrayPtr<const_char16_t> utf16_00;
  Vector<unsigned_char> result;
  char32_t value;
  EncodingResult<kj::String> utf;
  Vector<unsigned_char> local_b8;
  kj *local_90;
  char *local_88;
  uint local_80;
  uint local_7c;
  EncodingResult<kj::String> local_78;
  char *local_50;
  uint local_48;
  uint local_44;
  uint local_40;
  uint local_3c;
  EncodingResult<kj::Array<unsigned_char>_> *local_38;
  uint uVar9;
  
  pcVar10 = text.ptr;
  uVar9 = (uint)text.size_;
  bVar17 = false;
  local_90 = this;
  local_b8.builder.ptr =
       (uchar *)_::HeapArrayDisposer::allocateImpl
                          (1,0,(size_t)(pcVar10 + uVar9),(_func_void_void_ptr *)0x0,
                           (_func_void_void_ptr *)0x0);
  local_b8.builder.endPtr = (uchar *)(pcVar10 + uVar9 + (long)local_b8.builder.ptr);
  local_b8.builder.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  local_b8.builder.pos = local_b8.builder.ptr;
  if (pcVar10 != (char *)0x0) {
    bVar18 = false;
    bVar17 = false;
    pkVar5 = local_90;
    pcVar14 = (char *)0x0;
    local_88 = pcVar10;
    local_40 = uVar9;
    local_38 = __return_storage_ptr__;
    do {
      pcVar15 = pcVar14 + 1;
      kVar1 = pkVar5[(long)pcVar14];
      if (kVar1 == (kj)0x5c) {
        if (pcVar15 == pcVar10) {
          bVar17 = true;
          bVar18 = true;
        }
        else {
          kVar1 = (pkVar5 + 1)[(long)pcVar14];
          pcVar15 = pcVar14 + 2;
          if ((byte)kVar1 < 0x55) {
            if ((byte)kVar1 - 0x30 < 8) {
              uVar9 = (int)(char)kVar1 - 0x30;
              if (pcVar15 < pcVar10) {
                iVar8 = 0;
                do {
                  bVar13 = (byte)pkVar5[(long)pcVar15] & 0xf8;
                  uVar16 = uVar9 * 8 | (byte)pkVar5[(long)pcVar15] - 0x30;
                  pcVar15 = pcVar15 + (bVar13 == 0x30);
                  if ((bVar13 != 0x30) ||
                     (bVar17 = iVar8 != 0, iVar8 = iVar8 + -1, uVar9 = uVar16, bVar17)) break;
                } while (pcVar15 < pcVar10);
              }
              bVar17 = bVar18;
              if (0xff < uVar9) {
                bVar17 = true;
              }
              if (local_b8.builder.pos == local_b8.builder.endPtr) {
                sVar11 = ((long)local_b8.builder.endPtr - (long)local_b8.builder.ptr) * 2;
                if (local_b8.builder.endPtr == local_b8.builder.ptr) {
                  sVar11 = 4;
                }
                in_R10 = in_R10 & 0xffffffff;
                Vector<unsigned_char>::setCapacity(&local_b8,sVar11);
                pcVar10 = local_88;
                pkVar5 = local_90;
              }
LAB_00296346:
              *local_b8.builder.pos = (RemoveConst<unsigned_char>)SUB41(uVar9,0);
              bVar18 = bVar17;
            }
            else if (kVar1 == (kj)0x22) {
              if (local_b8.builder.pos == local_b8.builder.endPtr) {
                sVar11 = ((long)local_b8.builder.endPtr - (long)local_b8.builder.ptr) * 2;
                if (local_b8.builder.endPtr == local_b8.builder.ptr) {
                  sVar11 = 4;
                }
                in_R10 = in_R10 & 0xffffffff;
                Vector<unsigned_char>::setCapacity(&local_b8,sVar11);
                pcVar10 = local_88;
                pkVar5 = local_90;
              }
              *local_b8.builder.pos = '\"';
            }
            else {
              if (kVar1 != (kj)0x27) goto switchD_00296242_caseD_6f;
              if (local_b8.builder.pos == local_b8.builder.endPtr) {
                sVar11 = ((long)local_b8.builder.endPtr - (long)local_b8.builder.ptr) * 2;
                if (local_b8.builder.endPtr == local_b8.builder.ptr) {
                  sVar11 = 4;
                }
                in_R10 = in_R10 & 0xffffffff;
                Vector<unsigned_char>::setCapacity(&local_b8,sVar11);
                pcVar10 = local_88;
                pkVar5 = local_90;
              }
              *local_b8.builder.pos = '\'';
            }
          }
          else if ((byte)kVar1 < 0x62) {
            if (kVar1 == (kj)0x55) {
              uVar6 = 0;
              uVar9 = 0;
              do {
                if (pcVar15 == pcVar10) {
                  bVar17 = true;
                  local_80 = uVar9;
                  break;
                }
                kVar1 = pkVar5[(long)pcVar15];
                iVar8 = (int)(char)kVar1;
                if ((byte)((char)kVar1 - 0x30U) < 10) {
                  local_44 = iVar8 - 0x30;
LAB_00296457:
                  bVar18 = true;
                }
                else {
                  if ((byte)((char)kVar1 + 0x9fU) < 6) {
                    local_44 = iVar8 - 0x57;
                    goto LAB_00296457;
                  }
                  bVar18 = (byte)((char)kVar1 + 0xbfU) < 6;
                  if (bVar18) {
                    local_44 = iVar8 - 0x37;
                  }
                }
                local_80 = uVar9 << 4 | local_44;
                pcVar15 = pcVar15 + bVar18;
                if (bVar18 == false) {
                  bVar17 = true;
                  local_80 = uVar9;
                  break;
                }
                uVar16 = (uint)uVar6;
                uVar6 = (ulong)(uVar16 + 1);
                uVar9 = local_80;
              } while (uVar16 < 7);
              utf16.size_ = uVar6;
              utf16.ptr = (char32_t *)0x1;
              local_7c = (uint)in_R10;
              decodeUtf32(&local_78,(kj *)&local_80,utf16);
              sVar11 = local_78.super_String.content.size_;
              if (local_78.hadErrors != false) {
                bVar17 = true;
              }
              pcVar10 = (char *)local_78.super_String.content.size_;
              if ((char *)local_78.super_String.content.size_ != (char *)0x0) {
                pcVar10 = local_78.super_String.content.ptr;
              }
              pcVar14 = (char *)0x0;
              if ((char *)local_78.super_String.content.size_ != (char *)0x0) {
                pcVar14 = (char *)(local_78.super_String.content.size_ + -1);
              }
              pkVar5 = (kj *)(pcVar14 + ((long)local_b8.builder.pos - (long)local_b8.builder.ptr));
              if ((kj *)(local_b8.builder.endPtr + -(long)local_b8.builder.ptr) < pkVar5) {
                pkVar12 = (kj *)((long)(local_b8.builder.endPtr + -(long)local_b8.builder.ptr) * 2);
                if (local_b8.builder.endPtr == local_b8.builder.ptr) {
                  pkVar12 = (kj *)&DAT_00000004;
                }
                if (pkVar12 < pkVar5) {
                  pkVar12 = pkVar5;
                }
                local_50 = pcVar14;
                Vector<unsigned_char>::setCapacity(&local_b8,(size_t)pkVar12);
                pcVar14 = local_50;
              }
              pRVar2 = local_b8.builder.pos;
              if ((char *)0x1 < sVar11) {
                memcpy(local_b8.builder.pos,pcVar10,(size_t)pcVar14);
                local_b8.builder.pos = pRVar2 + (long)pcVar14;
              }
              sVar11 = local_78.super_String.content.size_;
              pcVar10 = local_78.super_String.content.ptr;
              if (local_78.super_String.content.ptr != (char *)0x0) {
                local_78.super_String.content.ptr = (char *)0x0;
                local_78.super_String.content.size_ = 0;
                (*(code *)**(undefined8 **)local_78.super_String.content.disposer)
                          (local_78.super_String.content.disposer,pcVar10,1,sVar11,sVar11,0);
              }
              goto LAB_00296a33;
            }
            if (kVar1 == (kj)0x5c) {
              if (local_b8.builder.pos == local_b8.builder.endPtr) {
                sVar11 = ((long)local_b8.builder.endPtr - (long)local_b8.builder.ptr) * 2;
                if (local_b8.builder.endPtr == local_b8.builder.ptr) {
                  sVar11 = 4;
                }
                in_R10 = in_R10 & 0xffffffff;
                Vector<unsigned_char>::setCapacity(&local_b8,sVar11);
                pcVar10 = local_88;
                pkVar5 = local_90;
              }
              *local_b8.builder.pos = '\\';
            }
            else {
              if (kVar1 != (kj)0x61) goto switchD_00296242_caseD_6f;
              if (local_b8.builder.pos == local_b8.builder.endPtr) {
                sVar11 = ((long)local_b8.builder.endPtr - (long)local_b8.builder.ptr) * 2;
                if (local_b8.builder.endPtr == local_b8.builder.ptr) {
                  sVar11 = 4;
                }
                in_R10 = in_R10 & 0xffffffff;
                Vector<unsigned_char>::setCapacity(&local_b8,sVar11);
                pcVar10 = local_88;
                pkVar5 = local_90;
              }
              *local_b8.builder.pos = '\a';
            }
          }
          else {
            switch(kVar1) {
            case (kj)0x6e:
              if (local_b8.builder.pos == local_b8.builder.endPtr) {
                sVar11 = ((long)local_b8.builder.endPtr - (long)local_b8.builder.ptr) * 2;
                if (local_b8.builder.endPtr == local_b8.builder.ptr) {
                  sVar11 = 4;
                }
                in_R10 = in_R10 & 0xffffffff;
                Vector<unsigned_char>::setCapacity(&local_b8,sVar11);
                pcVar10 = local_88;
                pkVar5 = local_90;
              }
              *local_b8.builder.pos = '\n';
              break;
            case (kj)0x6f:
            case (kj)0x70:
            case (kj)0x71:
            case (kj)0x73:
            case (kj)0x77:
switchD_00296242_caseD_6f:
              if (local_b8.builder.pos == local_b8.builder.endPtr) {
                sVar11 = ((long)local_b8.builder.endPtr - (long)local_b8.builder.ptr) * 2;
                if (local_b8.builder.endPtr == local_b8.builder.ptr) {
                  sVar11 = 4;
                }
                in_R10 = in_R10 & 0xffffffff;
                Vector<unsigned_char>::setCapacity(&local_b8,sVar11);
                pcVar10 = local_88;
                pkVar5 = local_90;
              }
              *local_b8.builder.pos = (RemoveConst<unsigned_char>)kVar1;
              break;
            case (kj)0x72:
              if (local_b8.builder.pos == local_b8.builder.endPtr) {
                sVar11 = ((long)local_b8.builder.endPtr - (long)local_b8.builder.ptr) * 2;
                if (local_b8.builder.endPtr == local_b8.builder.ptr) {
                  sVar11 = 4;
                }
                in_R10 = in_R10 & 0xffffffff;
                Vector<unsigned_char>::setCapacity(&local_b8,sVar11);
                pcVar10 = local_88;
                pkVar5 = local_90;
              }
              *local_b8.builder.pos = '\r';
              break;
            case (kj)0x74:
              if (local_b8.builder.pos == local_b8.builder.endPtr) {
                sVar11 = ((long)local_b8.builder.endPtr - (long)local_b8.builder.ptr) * 2;
                if (local_b8.builder.endPtr == local_b8.builder.ptr) {
                  sVar11 = 4;
                }
                in_R10 = in_R10 & 0xffffffff;
                Vector<unsigned_char>::setCapacity(&local_b8,sVar11);
                pcVar10 = local_88;
                pkVar5 = local_90;
              }
              *local_b8.builder.pos = '\t';
              break;
            case (kj)0x75:
              uVar6 = 0;
              uVar9 = 0;
              do {
                uVar4 = (undefined2)uVar9;
                if (pcVar15 == pcVar10) {
                  bVar17 = true;
                  uVar7 = uVar4;
                  break;
                }
                kVar1 = pkVar5[(long)pcVar15];
                iVar8 = (int)(char)kVar1;
                if ((byte)((char)kVar1 - 0x30U) < 10) {
                  local_48 = iVar8 - 0x30;
LAB_002967a3:
                  bVar18 = true;
                }
                else {
                  if ((byte)((char)kVar1 + 0x9fU) < 6) {
                    local_48 = iVar8 - 0x57;
                    goto LAB_002967a3;
                  }
                  bVar18 = (byte)((char)kVar1 + 0xbfU) < 6;
                  if (bVar18) {
                    local_48 = iVar8 - 0x37;
                  }
                }
                uVar9 = uVar9 << 4 | local_48;
                uVar7 = (undefined2)uVar9;
                pcVar15 = pcVar15 + bVar18;
                if (bVar18 == false) {
                  bVar17 = true;
                  uVar7 = uVar4;
                  break;
                }
                uVar16 = (uint)uVar6;
                uVar6 = (ulong)(uVar16 + 1);
              } while (uVar16 < 3);
              local_80 = CONCAT22((short)(local_80 >> 0x10),uVar7);
              utf16_00.size_ = uVar6;
              utf16_00.ptr = (char16_t *)0x1;
              local_7c = (uint)in_R10;
              decodeUtf16(&local_78,(kj *)&local_80,utf16_00);
              sVar11 = local_78.super_String.content.size_;
              if (local_78.hadErrors != false) {
                bVar17 = true;
              }
              pcVar10 = (char *)local_78.super_String.content.size_;
              if ((char *)local_78.super_String.content.size_ != (char *)0x0) {
                pcVar10 = local_78.super_String.content.ptr;
              }
              pcVar14 = (char *)0x0;
              if ((char *)local_78.super_String.content.size_ != (char *)0x0) {
                pcVar14 = (char *)(local_78.super_String.content.size_ + -1);
              }
              pkVar5 = (kj *)(pcVar14 + ((long)local_b8.builder.pos - (long)local_b8.builder.ptr));
              if ((kj *)(local_b8.builder.endPtr + -(long)local_b8.builder.ptr) < pkVar5) {
                pkVar12 = (kj *)((long)(local_b8.builder.endPtr + -(long)local_b8.builder.ptr) * 2);
                if (local_b8.builder.endPtr == local_b8.builder.ptr) {
                  pkVar12 = (kj *)&DAT_00000004;
                }
                if (pkVar12 < pkVar5) {
                  pkVar12 = pkVar5;
                }
                local_50 = pcVar14;
                Vector<unsigned_char>::setCapacity(&local_b8,(size_t)pkVar12);
                pcVar14 = local_50;
              }
              pRVar2 = local_b8.builder.pos;
              if ((char *)0x1 < sVar11) {
                memcpy(local_b8.builder.pos,pcVar10,(size_t)pcVar14);
                local_b8.builder.pos = pRVar2 + (long)pcVar14;
              }
              sVar11 = local_78.super_String.content.size_;
              pcVar10 = local_78.super_String.content.ptr;
              if (local_78.super_String.content.ptr != (char *)0x0) {
                local_78.super_String.content.ptr = (char *)0x0;
                local_78.super_String.content.size_ = 0;
                (*(code *)**(undefined8 **)local_78.super_String.content.disposer)
                          (local_78.super_String.content.disposer,pcVar10,1,sVar11,sVar11,0);
              }
LAB_00296a33:
              in_R10 = (ulong)local_7c;
              pcVar10 = local_88;
              pkVar5 = local_90;
              bVar18 = bVar17;
              goto LAB_00296353;
            case (kj)0x76:
              if (local_b8.builder.pos == local_b8.builder.endPtr) {
                sVar11 = ((long)local_b8.builder.endPtr - (long)local_b8.builder.ptr) * 2;
                if (local_b8.builder.endPtr == local_b8.builder.ptr) {
                  sVar11 = 4;
                }
                in_R10 = in_R10 & 0xffffffff;
                Vector<unsigned_char>::setCapacity(&local_b8,sVar11);
                pcVar10 = local_88;
                pkVar5 = local_90;
              }
              *local_b8.builder.pos = '\v';
              break;
            case (kj)0x78:
              uVar16 = 0;
              uVar3 = local_3c;
              do {
                local_3c = uVar3;
                uVar9 = uVar16;
                if (pcVar10 <= pcVar15) break;
                kVar1 = pkVar5[(long)pcVar15];
                iVar8 = (int)(char)kVar1;
                if ((byte)((char)kVar1 - 0x30U) < 10) {
                  uVar16 = iVar8 - 0x30;
LAB_00296860:
                  bVar18 = true;
                  in_R10 = (ulong)uVar16;
                }
                else {
                  if ((byte)((char)kVar1 + 0x9fU) < 6) {
                    uVar16 = iVar8 - 0x57;
                    goto LAB_00296860;
                  }
                  bVar18 = (byte)((char)kVar1 + 0xbfU) < 6;
                  in_R10 = in_R10 & 0xffffffff;
                  if (bVar18) {
                    in_R10 = (ulong)(iVar8 - 0x37);
                  }
                }
                pcVar15 = pcVar15 + bVar18;
                uVar16 = uVar9 << 4 | (uint)in_R10;
                uVar3 = (uint)in_R10;
              } while (bVar18 != false);
              if (0xff < uVar9) {
                bVar17 = true;
              }
              if (local_b8.builder.pos == local_b8.builder.endPtr) {
                sVar11 = ((long)local_b8.builder.endPtr - (long)local_b8.builder.ptr) * 2;
                if (local_b8.builder.endPtr == local_b8.builder.ptr) {
                  sVar11 = 4;
                }
                in_R10 = in_R10 & 0xffffffff;
                Vector<unsigned_char>::setCapacity(&local_b8,sVar11);
                pcVar10 = local_88;
                pkVar5 = local_90;
              }
              goto LAB_00296346;
            default:
              if (kVar1 == (kj)0x62) {
                if (local_b8.builder.pos == local_b8.builder.endPtr) {
                  sVar11 = ((long)local_b8.builder.endPtr - (long)local_b8.builder.ptr) * 2;
                  if (local_b8.builder.endPtr == local_b8.builder.ptr) {
                    sVar11 = 4;
                  }
                  in_R10 = in_R10 & 0xffffffff;
                  Vector<unsigned_char>::setCapacity(&local_b8,sVar11);
                  pcVar10 = local_88;
                  pkVar5 = local_90;
                }
                *local_b8.builder.pos = '\b';
              }
              else {
                if (kVar1 != (kj)0x66) goto switchD_00296242_caseD_6f;
                if (local_b8.builder.pos == local_b8.builder.endPtr) {
                  sVar11 = ((long)local_b8.builder.endPtr - (long)local_b8.builder.ptr) * 2;
                  if (local_b8.builder.endPtr == local_b8.builder.ptr) {
                    sVar11 = 4;
                  }
                  in_R10 = in_R10 & 0xffffffff;
                  Vector<unsigned_char>::setCapacity(&local_b8,sVar11);
                  pcVar10 = local_88;
                  pkVar5 = local_90;
                }
                *local_b8.builder.pos = '\f';
              }
            }
          }
          local_b8.builder.pos = local_b8.builder.pos + 1;
        }
      }
      else {
        if (local_b8.builder.pos == local_b8.builder.endPtr) {
          sVar11 = ((long)local_b8.builder.endPtr - (long)local_b8.builder.ptr) * 2;
          if (local_b8.builder.endPtr == local_b8.builder.ptr) {
            sVar11 = 4;
          }
          in_R10 = in_R10 & 0xffffffff;
          Vector<unsigned_char>::setCapacity(&local_b8,sVar11);
          pcVar10 = local_88;
          pkVar5 = local_90;
        }
        *local_b8.builder.pos = (RemoveConst<unsigned_char>)kVar1;
        local_b8.builder.pos = local_b8.builder.pos + 1;
      }
LAB_00296353:
      pcVar14 = pcVar15;
      __return_storage_ptr__ = local_38;
      uVar9 = local_40;
    } while (pcVar15 < pcVar10);
  }
  if ((char)uVar9 != '\0') {
    if (local_b8.builder.pos == local_b8.builder.endPtr) {
      sVar11 = 4;
      if (local_b8.builder.endPtr != local_b8.builder.ptr) {
        sVar11 = ((long)local_b8.builder.endPtr - (long)local_b8.builder.ptr) * 2;
      }
      Vector<unsigned_char>::setCapacity(&local_b8,sVar11);
    }
    *local_b8.builder.pos = '\0';
    local_b8.builder.pos = local_b8.builder.pos + 1;
  }
  if (local_b8.builder.pos != local_b8.builder.endPtr) {
    Vector<unsigned_char>::setCapacity
              (&local_b8,(long)local_b8.builder.pos - (long)local_b8.builder.ptr);
  }
  (__return_storage_ptr__->super_Array<unsigned_char>).ptr = local_b8.builder.ptr;
  (__return_storage_ptr__->super_Array<unsigned_char>).size_ =
       (long)local_b8.builder.pos - (long)local_b8.builder.ptr;
  (__return_storage_ptr__->super_Array<unsigned_char>).disposer = local_b8.builder.disposer;
  __return_storage_ptr__->hadErrors = bVar17;
  return __return_storage_ptr__;
}

Assistant:

EncodingResult<Array<byte>> decodeBinaryCEscape(ArrayPtr<const char> text, bool nulTerminate) {
  Vector<byte> result(text.size() + nulTerminate);
  bool hadErrors = false;

  size_t i = 0;
  while (i < text.size()) {
    char c = text[i++];
    if (c == '\\') {
      if (i == text.size()) {
        hadErrors = true;
        continue;
      }
      char c2 = text[i++];
      switch (c2) {
        case 'a' : result.add('\a'); break;
        case 'b' : result.add('\b'); break;
        case 'f' : result.add('\f'); break;
        case 'n' : result.add('\n'); break;
        case 'r' : result.add('\r'); break;
        case 't' : result.add('\t'); break;
        case 'v' : result.add('\v'); break;
        case '\'': result.add('\''); break;
        case '\"': result.add('\"'); break;
        case '\\': result.add('\\'); break;

        case '0':
        case '1':
        case '2':
        case '3':
        case '4':
        case '5':
        case '6':
        case '7': {
          uint value = c2 - '0';
          for (uint j = 0; j < 2 && i < text.size(); j++) {
            KJ_IF_SOME(d, tryFromOctDigit(text[i])) {
              ++i;
              value = (value << 3) | d;
            } else {
              break;
            }
          }
          if (value >= 0x100) hadErrors = true;
          result.add(value);
          break;
        }

        case 'x': {
          uint value = 0;
          while (i < text.size()) {
            KJ_IF_SOME(d, tryFromHexDigit(text[i])) {
              ++i;
              value = (value << 4) | d;
            } else {
              break;
            }
          }
          if (value >= 0x100) hadErrors = true;
          result.add(value);
          break;
        }

        case 'u': {
          char16_t value = 0;
          for (uint j = 0; j < 4; j++) {
            if (i == text.size()) {
              hadErrors = true;
              break;
            } else KJ_IF_SOME(d, tryFromHexDigit(text[i])) {
              ++i;
              value = (value << 4) | d;
            } else {
              hadErrors = true;
              break;
            }
          }
          auto utf = decodeUtf16(arrayPtr(&value, 1));
          if (utf.hadErrors) hadErrors = true;
          result.addAll(utf.asBytes());
          break;
        }

        case 'U': {
          char32_t value = 0;
          for (uint j = 0; j < 8; j++) {
            if (i == text.size()) {
              hadErrors = true;
              break;
            } else KJ_IF_SOME(d, tryFromHexDigit(text[i])) {
              ++i;
              value = (value << 4) | d;
            } else {
              hadErrors = true;
              break;
            }
          }
          auto utf = decodeUtf32(arrayPtr(&value, 1));
          if (utf.hadErrors) hadErrors = true;
          result.addAll(utf.asBytes());
          break;
        }